

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addDiff(DdManager *dd,DdNode **f,DdNode **g)

{
  anon_union_16_2_50f58667_for_type *paVar1;
  double dVar2;
  DdManager *pDVar3;
  DdManager *pDVar4;
  DdNode *G;
  DdNode *F;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  pDVar3 = (DdManager *)*f;
  pDVar4 = (DdManager *)*g;
  if (pDVar3 == pDVar4) {
    dd_local = (DdManager *)dd->plusinfinity;
  }
  else {
    dd_local = pDVar4;
    if ((pDVar3 != (DdManager *)dd->plusinfinity) &&
       (dd_local = pDVar3, pDVar4 != (DdManager *)dd->plusinfinity)) {
      if (((pDVar3->sentinel).index == 0x7fffffff) && ((pDVar4->sentinel).index == 0x7fffffff)) {
        dVar2 = (pDVar3->sentinel).type.value;
        paVar1 = &(pDVar4->sentinel).type;
        if ((dVar2 != paVar1->value) || (NAN(dVar2) || NAN(paVar1->value))) {
          dd_local = pDVar4;
          if ((pDVar3->sentinel).type.value < (pDVar4->sentinel).type.value) {
            dd_local = pDVar3;
          }
        }
        else {
          dd_local = (DdManager *)dd->plusinfinity;
        }
      }
      else {
        dd_local = (DdManager *)0x0;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addDiff(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G) return(DD_PLUS_INFINITY(dd));
    if (F == DD_PLUS_INFINITY(dd)) return(G);
    if (G == DD_PLUS_INFINITY(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        if (cuddV(F) != cuddV(G)) {
            if (cuddV(F) < cuddV(G)) {
                return(F);
            } else {
                return(G);
            }
        } else {
            return(DD_PLUS_INFINITY(dd));
        }
    }
    return(NULL);

}